

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_half_to_float_3chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    pvVar7 = decode->unpacked_buffer;
    uVar2 = peVar4->width;
    puVar11 = (uint *)(peVar4->field_12).decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    lVar12 = (long)(int)(uVar2 * 6);
    pvVar13 = (void *)((long)pvVar7 + (long)(int)uVar2 * 4);
    pvVar14 = (void *)((long)pvVar7 + (long)(int)uVar2 * 2);
    iVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar16 = 0;
        puVar17 = puVar11;
        do {
          uVar9 = (uint)*(short *)((long)pvVar7 + uVar16 * 2);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *puVar17 = uVar10;
          uVar9 = (uint)*(short *)((long)pvVar14 + uVar16 * 2);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          puVar17[1] = uVar10;
          uVar9 = (uint)*(short *)((long)pvVar13 + uVar16 * 2);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          puVar17[2] = uVar10;
          puVar17 = puVar17 + 3;
          uVar16 = uVar16 + 1;
        } while (uVar2 != uVar16);
      }
      pvVar7 = (void *)((long)pvVar7 + lVar12);
      puVar11 = (uint *)((long)puVar11 + (long)iVar3);
      iVar8 = iVar8 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar12);
      pvVar14 = (void *)((long)pvVar14 + lVar12);
    } while (iVar8 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in0[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in2[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}